

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::formatReferenceColor
          (SRGBTestCase *this,Vec4 *referenceColor)

{
  deUint32 dVar1;
  float *pfVar2;
  Vector<float,_4> *in_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 uVar3;
  undefined8 in_XMM1_Qa;
  Vec4 VVar4;
  Vec4 *referenceColor_local;
  SRGBTestCase *this_local;
  
  dVar1 = glu::getInternalFormat(*(TextureFormat *)(referenceColor[0x14].m_data + 3));
  if (dVar1 == 0x8c43) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,in_RDX);
    uVar3 = extraout_XMM0_Qa;
  }
  else if (dVar1 == 0x8fbd) {
    pfVar2 = tcu::Vector<float,_4>::y(in_RDX);
    *pfVar2 = 0.0;
    pfVar2 = tcu::Vector<float,_4>::z(in_RDX);
    *pfVar2 = 0.0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,in_RDX);
    uVar3 = extraout_XMM0_Qa_00;
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,in_RDX);
    uVar3 = extraout_XMM0_Qa_01;
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)((ulong)uVar3 >> 0x20);
  return (Vec4)VVar4.m_data;
}

Assistant:

tcu::Vec4 SRGBTestCase::formatReferenceColor (tcu::Vec4 referenceColor)
{
	switch (glu::getInternalFormat(m_internalFormat))
	{
		case GL_SRGB8_ALPHA8:
		{
			return referenceColor;
		}
		case GL_SR8_EXT:
		{
			// zero unwanted color channels
			referenceColor.y() = 0;
			referenceColor.z() = 0;
			return referenceColor;
		}
		default:
		{
			DE_FATAL("Error: Internal format not recognised");
			return referenceColor;
		}
	}
}